

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inversion.cpp
# Opt level: O2

void __thiscall
OpenMD::Inversion::Inversion
          (Inversion *this,Atom *atom1,Atom *atom2,Atom *atom3,Atom *atom4,InversionType *it)

{
  InversionKey IVar1;
  
  ShortRangeInteraction::ShortRangeInteraction(&this->super_ShortRangeInteraction);
  (this->super_ShortRangeInteraction)._vptr_ShortRangeInteraction =
       (_func_int **)&PTR__Inversion_002c18b0;
  this->inversionType_ = it;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::resize
            (&(this->super_ShortRangeInteraction).atoms_,4);
  *(this->super_ShortRangeInteraction).atoms_.
   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
   super__Vector_impl_data._M_start = atom1;
  (this->super_ShortRangeInteraction).atoms_.
  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_start[1] = atom2;
  (this->super_ShortRangeInteraction).atoms_.
  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_start[2] = atom3;
  (this->super_ShortRangeInteraction).atoms_.
  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
  super__Vector_impl_data._M_start[3] = atom4;
  IVar1 = (*this->inversionType_->_vptr_InversionType[3])();
  this->inversionKey_ = IVar1;
  return;
}

Assistant:

Inversion::Inversion(Atom* atom1, Atom* atom2, Atom* atom3, Atom* atom4,
                       InversionType* it) :
      ShortRangeInteraction(),
      inversionType_(it) {
    atoms_.resize(4);
    atoms_[0] = atom1;
    atoms_[1] = atom2;
    atoms_[2] = atom3;
    atoms_[3] = atom4;

    inversionKey_ = inversionType_->getKey();
  }